

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void google::protobuf::anon_unknown_0::ExpectContainsType
               (FileDescriptorProto *proto,string *type_name)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  undefined8 *puVar4;
  pointer *__ptr;
  int iVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  
  iVar5 = *(int *)((long)&proto->field_0 + 0x28);
  bVar1 = 0 < iVar5;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,iVar5);
      puVar4 = (undefined8 *)
               ((ulong)(pVVar3->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      __n = puVar4[1];
      if ((__n == type_name->_M_string_length) &&
         ((__n == 0 || (iVar2 = bcmp((void *)*puVar4,(type_name->_M_dataplus)._M_p,__n), iVar2 == 0)
          ))) {
        if (bVar1) {
          return;
        }
        break;
      }
      iVar5 = iVar5 + 1;
      iVar2 = *(int *)((long)&proto->field_0 + 0x28);
      bVar1 = iVar5 < iVar2;
    } while (iVar5 < iVar2);
  }
  testing::Message::Message((Message *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"\"",1);
  puVar4 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),(char *)*puVar4,puVar4[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"\" did not contain expected type \"",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),(type_name->_M_dataplus)._M_p,
             type_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_38._M_head_impl + 0x10),"\".",2);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,0x2b,"Failed");
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void ExpectContainsType(const FileDescriptorProto& proto,
                               const std::string& type_name) {
  for (int i = 0; i < proto.message_type_size(); i++) {
    if (proto.message_type(i).name() == type_name) return;
  }
  ADD_FAILURE() << "\"" << proto.name() << "\" did not contain expected type \""
                << type_name << "\".";
}